

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

shared_ptr<vmips::Function> __thiscall
vmips::Module::create_function(Module *this,string *fname,size_t argc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::Function> sVar1;
  undefined1 local_29;
  size_t argc_local;
  string *fname_local;
  Module *this_local;
  shared_ptr<vmips::Function> *function;
  
  local_29 = 0;
  argc_local = argc;
  fname_local = fname;
  this_local = this;
  std::make_shared<vmips::Function,std::__cxx11::string,unsigned_long&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (unsigned_long *)argc);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
  ;
  Function::entry((Function *)&stack0xffffffffffffffc0);
  std::shared_ptr<vmips::CFGNode>::~shared_ptr
            ((shared_ptr<vmips::CFGNode> *)&stack0xffffffffffffffc0);
  std::vector<std::shared_ptr<vmips::Function>,_std::allocator<std::shared_ptr<vmips::Function>_>_>
  ::push_back((vector<std::shared_ptr<vmips::Function>,_std::allocator<std::shared_ptr<vmips::Function>_>_>
               *)(fname + 0x18),(value_type *)this);
  sVar1.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<vmips::Function>)
         sVar1.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Function> Module::create_function(std::string fname, size_t argc) {
    auto function = std::make_shared<Function>(std::move(fname), argc);
    function->entry();
    functions.push_back(function);
    return function;
}